

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_local_value.hpp
# Opt level: O0

long __thiscall
ylt::metric::thread_local_value<long>::update(thread_local_value<long> *this,long value)

{
  long lVar1;
  atomic<long> *paVar2;
  size_type sVar3;
  __pointer_type paVar4;
  __int_type in_RSI;
  vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
  *in_RDI;
  size_t i;
  long val;
  __pointer_type in_stack_ffffffffffffff60;
  memory_order __m;
  atomic<std::atomic<long>_*> *in_stack_ffffffffffffff68;
  thread_local_value<long> *in_stack_ffffffffffffff80;
  ulong local_70;
  long local_68;
  
  paVar2 = get_value(in_stack_ffffffffffffff80,(size_t)in_RDI);
  LOCK();
  local_68 = (paVar2->super___atomic_base<long>)._M_i;
  (paVar2->super___atomic_base<long>)._M_i = in_RSI;
  UNLOCK();
  for (local_70 = 1;
      sVar3 = std::
              vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>
              ::size(in_RDI), local_70 < sVar3; local_70 = local_70 + 1) {
    std::
    vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>::
    operator[](in_RDI,local_70);
    paVar4 = std::atomic::operator_cast_to_atomic_((atomic<std::atomic<long>_*> *)0x1addd0);
    __m = (memory_order)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    if (paVar4 != (__pointer_type)0x0) {
      std::
      vector<std::atomic<std::atomic<long>_*>,_std::allocator<std::atomic<std::atomic<long>_*>_>_>::
      operator[](in_RDI,local_70);
      in_stack_ffffffffffffff60 =
           std::atomic<std::atomic<long>_*>::load(in_stack_ffffffffffffff68,__m);
      in_stack_ffffffffffffff68 = (atomic<std::atomic<long>_*> *)0xffffffff;
      LOCK();
      lVar1 = (in_stack_ffffffffffffff60->super___atomic_base<long>)._M_i;
      (in_stack_ffffffffffffff60->super___atomic_base<long>)._M_i = 0;
      UNLOCK();
      local_68 = lVar1 + local_68;
    }
  }
  return local_68;
}

Assistant:

value_type update(value_type value = 1) {
    value_type val = get_value(0).exchange(value, std::memory_order::relaxed);
    for (size_t i = 1; i < duplicates_.size(); i++) {
      if (duplicates_[i]) {
        val += duplicates_[i].load()->exchange(0, std::memory_order::relaxed);
      }
    }
    return val;
  }